

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O1

void displayLimitCycleInfo
               (ostream *o,PolynomialFDS *pds,
               vector<ComponentData,_std::allocator<ComponentData>_> *cycleinfo)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  ostream *poVar5;
  long *plVar6;
  pointer pCVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  State u;
  vector<int,_std::allocator<int>_> local_68;
  allocator_type local_49;
  vector<ComponentData,_std::allocator<ComponentData>_> *local_48;
  ulong local_40;
  value_type_conflict local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"Number of cycles (components): ",0x1f);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  iVar1 = pds->mNumStates;
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_68,
             (long)(int)((ulong)((long)(pds->mPolynomials).
                                       super__Vector_base<Polynomial,_std::allocator<Polynomial>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pds->mPolynomials).
                                      super__Vector_base<Polynomial,_std::allocator<Polynomial>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 6),&local_34,
             &local_49);
  pCVar7 = (cycleinfo->super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_48 = cycleinfo;
  if ((cycleinfo->super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar7) {
    uVar14 = 0;
    do {
      lVar13 = (long)pCVar7[uVar14].limitCycle.super__Vector_base<long,_std::allocator<long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)pCVar7[uVar14].limitCycle.super__Vector_base<long,_std::allocator<long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>(o,"COMPONENT #",0xb);
      uVar8 = uVar14 + 1;
      poVar5 = std::ostream::_M_insert<long>((long)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(o,"  component size: ",0x12);
      poVar5 = std::ostream::_M_insert<long>((long)o);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      cVar3 = (char)o;
      if (lVar13 == 8) {
        uVar4 = (int)((ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) - 1;
        if (-1 < (int)uVar4) {
          lVar13 = **(long **)&(local_48->
                               super__Vector_base<ComponentData,_std::allocator<ComponentData>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar14].limitCycle.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl;
          lVar9 = (ulong)uVar4 + 1;
          do {
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar9 + -1] = (int)(lVar13 % (long)iVar1);
            lVar13 = lVar13 / (long)iVar1;
            lVar10 = lVar9 + -1;
            bVar2 = 0 < lVar9;
            lVar9 = lVar10;
          } while (lVar10 != 0 && bVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(o,"  fixed point: [",0x10);
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          uVar14 = 0;
          do {
            if (uVar14 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
            }
            std::ostream::operator<<
                      (o,local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar14]);
            uVar14 = uVar14 + 1;
          } while (uVar14 < (ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>(o,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
        std::ostream::put(cVar3);
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(o,"  cycle of length ",0x12);
        lVar13 = lVar13 >> 3;
        poVar5 = std::ostream::_M_insert<long>((long)o);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        local_40 = uVar8;
        if (0 < lVar13) {
          lVar9 = 0;
          do {
            uVar4 = (int)((ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
            if (-1 < (int)uVar4) {
              lVar10 = *(long *)(*(long *)&(local_48->
                                           super__Vector_base<ComponentData,_std::allocator<ComponentData>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar14].
                                           limitCycle.
                                           super__Vector_base<long,_std::allocator<long>_>._M_impl +
                                lVar9 * 8);
              lVar11 = (ulong)uVar4 + 1;
              do {
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11 + -1] = (int)(lVar10 % (long)iVar1);
                lVar10 = lVar10 / (long)iVar1;
                lVar12 = lVar11 + -1;
                bVar2 = 0 < lVar11;
                lVar11 = lVar12;
              } while (lVar12 != 0 && bVar2);
            }
            std::__ostream_insert<char,std::char_traits<char>>(o,"    [",5);
            if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar8 = 0;
              do {
                if (uVar8 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
                }
                std::ostream::operator<<
                          (o,local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar8]);
                uVar8 = uVar8 + 1;
              } while (uVar8 < (ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start >> 2));
            }
            std::__ostream_insert<char,std::char_traits<char>>(o,"] -> ",5);
            std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
            lVar9 = lVar9 + 1;
          } while (lVar9 != lVar13);
        }
        uVar4 = (int)((ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) - 1;
        if (-1 < (int)uVar4) {
          lVar13 = **(long **)&(local_48->
                               super__Vector_base<ComponentData,_std::allocator<ComponentData>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar14].limitCycle.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl;
          lVar9 = (ulong)uVar4 + 1;
          do {
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar9 + -1] = (int)(lVar13 % (long)iVar1);
            lVar13 = lVar13 / (long)iVar1;
            lVar10 = lVar9 + -1;
            bVar2 = 0 < lVar9;
            lVar9 = lVar10;
          } while (lVar10 != 0 && bVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(o,"    [",5);
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          uVar14 = 0;
          do {
            if (uVar14 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
            }
            std::ostream::operator<<
                      (o,local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar14]);
            uVar14 = uVar14 + 1;
          } while (uVar14 < (ulong)((long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>(o,"]",1);
        uVar8 = local_40;
        std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
        std::ostream::put(cVar3);
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      }
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      pCVar7 = (local_48->super__Vector_base<ComponentData,_std::allocator<ComponentData>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar14 = uVar8;
    } while (uVar8 < (ulong)((long)(local_48->
                                   super__Vector_base<ComponentData,_std::allocator<ComponentData>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 5))
    ;
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void displayLimitCycleInfo(std::ostream& o,
                           const PolynomialFDS& pds,
                           const std::vector<ComponentData>& cycleinfo)
{
  o << "Number of cycles (components): " << cycleinfo.size() << std::endl << std::endl;
  State u(pds.numStates(), pds.numVariables());  
  for (long i=0; i<cycleinfo.size(); i++)
    {
      long cyclelen = cycleinfo[i].limitCycle.size();
      o << "COMPONENT #" << i+1 << ":" << std::endl;
      o << "  component size: " << cycleinfo[i].componentSize << std::endl;
      if (cyclelen == 1)
        {
          u.setFromIndex(cycleinfo[i].limitCycle[0]);
          o << "  fixed point: [" << u << "]" << std::endl << std::endl;
        }
      else {
        o << "  cycle of length " << cyclelen << ": " << std::endl;
        for (int j=0; j<cyclelen; j++)
          {
            u.setFromIndex(cycleinfo[i].limitCycle[j]);
            o << "    [" << u << "] -> " << std::endl;
          }
        u.setFromIndex(cycleinfo[i].limitCycle[0]);
        o << "    [" << u << "]" << std::endl << std::endl;
      }
    }
}